

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  llama_model_ptr chat_template_override;
  _Alloc_hider _Var2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  char *pcVar10;
  undefined8 uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined8 uVar17;
  int prev_len;
  llama_token new_token_id;
  common_chat_templates_ptr chat_templates;
  int new_len;
  vector<int,_std::allocator<int>_> tokens;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  string prompt;
  File file;
  undefined4 local_408 [2];
  undefined4 auStack_400 [2];
  undefined4 local_3f8 [2];
  undefined4 auStack_3f0 [2];
  char local_3e8 [16];
  string local_3d8;
  string piece;
  LlamaData llama_data;
  undefined1 *local_338 [2];
  undefined1 local_328 [16];
  string chat_template;
  Opt opt;
  char buf [256];
  
  buf._0_8_ = sigint_handler;
  sigemptyset((sigset_t *)(buf + 8));
  buf[0x88] = '\0';
  buf[0x89] = '\0';
  buf[0x8a] = '\0';
  buf[0x8b] = '\0';
  iVar6 = 0;
  sigaction(2,(sigaction *)buf,(sigaction *)0x0);
  opt.model_._M_dataplus._M_p = (pointer)&opt.model_.field_2;
  opt.model_._M_string_length = 0;
  opt.model_.field_2._M_local_buf[0] = '\0';
  opt.chat_template_file._M_dataplus._M_p = (pointer)&opt.chat_template_file.field_2;
  opt.chat_template_file._M_string_length = 0;
  opt.chat_template_file.field_2._M_local_buf[0] = '\0';
  opt.user._M_dataplus._M_p = (pointer)&opt.user.field_2;
  opt.user._M_string_length = 0;
  opt.user.field_2._M_local_buf[0] = '\0';
  opt.use_jinja = false;
  opt.context_size = -1;
  opt.ngl = -1;
  opt.n_threads = -1;
  opt.temperature = -1.0;
  opt.verbose = false;
  opt.context_size_default = -1;
  opt.ngl_default = -1;
  opt.n_threads_default = -1;
  opt.temperature_default = -1.0;
  opt.help = false;
  iVar5 = Opt::init(&opt,(EVP_PKEY_CTX *)(ulong)(uint)argc);
  if (iVar5 != 0) {
    if (iVar5 != 2) {
      iVar6 = 1;
    }
    goto LAB_0012a052;
  }
  iVar6 = isatty(0);
  if (iVar6 == 0) {
    if (opt.user._M_string_length != 0) {
      std::__cxx11::string::append((char *)&opt.user);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)buf);
    std::ostream::operator<<
              ((ostream *)buf,
               *(streambuf **)(std::__cxx11::string::find + *(long *)(std::cin + -0x18)));
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)buf);
    std::__cxx11::string::append((string *)&opt.user);
    std::__cxx11::string::~string((string *)&llama_data);
  }
  llama_log_set(log_callback,&opt);
  llama_data.msg_strs.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&llama_data.msg_strs;
  llama_data.messages.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  llama_data.messages.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  llama_data.context._M_t.super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
  super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
  super__Head_base<0UL,_llama_context_*,_false>._M_head_impl =
       (__uniq_ptr_data<llama_context,_llama_context_deleter,_true,_true>)
       (__uniq_ptr_impl<llama_context,_llama_context_deleter>)0x0;
  llama_data.messages.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  llama_data.model._M_t.super___uniq_ptr_impl<llama_model,_llama_model_deleter>._M_t.
  super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
  super__Head_base<0UL,_llama_model_*,_false>._M_head_impl =
       (__uniq_ptr_data<llama_model,_llama_model_deleter,_true,_true>)
       (__uniq_ptr_impl<llama_model,_llama_model_deleter>)0x0;
  llama_data.sampler._M_t.super___uniq_ptr_impl<llama_sampler,_llama_sampler_deleter>._M_t.
  super__Tuple_impl<0UL,_llama_sampler_*,_llama_sampler_deleter>.
  super__Head_base<0UL,_llama_sampler_*,_false>._M_head_impl =
       (__uniq_ptr_data<llama_sampler,_llama_sampler_deleter,_true,_true>)
       (__uniq_ptr_impl<llama_sampler,_llama_sampler_deleter>)0x0;
  llama_data.msg_strs.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  llama_data.fmtted.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  llama_data.fmtted.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  llama_data.fmtted.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  llama_data.msg_strs.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       llama_data.msg_strs.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  iVar6 = LlamaData::init(&llama_data,(EVP_PKEY_CTX *)&opt);
  if (iVar6 == 0) {
    prev_len = 0;
    uVar7 = llama_n_ctx(llama_data.context._M_t.
                        super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                        super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                        super__Head_base<0UL,_llama_context_*,_false>._M_head_impl);
    std::vector<char,_std::allocator<char>_>::resize(&llama_data.fmtted,(ulong)uVar7);
    chat_template._M_dataplus._M_p = (pointer)&chat_template.field_2;
    chat_template._M_string_length = 0;
    chat_template.field_2._M_local_buf[0] = '\0';
    if (opt.chat_template_file._M_string_length != 0) {
      file.file = (FILE *)0x0;
      file.fd = -1;
      file.file = (FILE *)ggml_fopen(opt.chat_template_file._M_dataplus._M_p,"r");
      _Var2 = opt.chat_template_file._M_dataplus;
      if (file.file == (FILE *)0x0) {
        piVar9 = __errno_location();
        pcVar10 = strerror(*piVar9);
        printe("Error opening chat template file \'%s\': %s",_Var2._M_p,pcVar10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)buf,"",(allocator<char> *)local_338);
      }
      else {
        File::to_string_abi_cxx11_((string *)buf,&file);
      }
      File::~File(&file);
      std::__cxx11::string::operator=((string *)&chat_template,(string *)buf);
      std::__cxx11::string::~string((string *)buf);
    }
    chat_template_override._M_t.super___uniq_ptr_impl<llama_model,_llama_model_deleter>._M_t.
    super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
    super__Head_base<0UL,_llama_model_*,_false>._M_head_impl =
         llama_data.model._M_t.super___uniq_ptr_impl<llama_model,_llama_model_deleter>._M_t.
         super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
         super__Head_base<0UL,_llama_model_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)buf,"",(allocator<char> *)local_338);
    std::__cxx11::string::string<std::allocator<char>>((string *)&file,"",(allocator<char> *)&piece)
    ;
    common_chat_templates_init
              ((llama_model *)&chat_templates,
               (string *)
               chat_template_override._M_t.super___uniq_ptr_impl<llama_model,_llama_model_deleter>.
               _M_t.super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
               super__Head_base<0UL,_llama_model_*,_false>._M_head_impl,&chat_template,(string *)buf
              );
    std::__cxx11::string::~string((string *)&file);
    std::__cxx11::string::~string((string *)buf);
    if (chat_loop(LlamaData&,Opt_const&)::stdout_a_terminal == '\0') {
      iVar6 = __cxa_guard_acquire(&chat_loop(LlamaData&,Opt_const&)::stdout_a_terminal);
      if (iVar6 != 0) {
        iVar6 = isatty(1);
        chat_loop(LlamaData&,Opt_const&)::stdout_a_terminal = iVar6 != 0;
        __cxa_guard_release(&chat_loop(LlamaData&,Opt_const&)::stdout_a_terminal);
      }
    }
    iVar6 = 1;
    do {
      local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
      local_458._M_string_length = 0;
      local_458.field_2._M_local_buf[0] = '\0';
      while (opt.user._M_string_length == 0) {
        if (read_user_input(std::__cxx11::string&)::prompt_prefix_env == '\0') {
          iVar5 = __cxa_guard_acquire(&read_user_input(std::__cxx11::string&)::prompt_prefix_env);
          if (iVar5 != 0) {
            read_user_input(std::__cxx11::string&)::prompt_prefix_env =
                 getenv("LLAMA_PROMPT_PREFIX");
            __cxa_guard_release(&read_user_input(std::__cxx11::string&)::prompt_prefix_env);
          }
        }
        if (read_user_input(std::__cxx11::string&)::prompt_prefix == '\0') {
          iVar5 = __cxa_guard_acquire(&read_user_input(std::__cxx11::string&)::prompt_prefix);
          if (iVar5 != 0) {
            read_user_input(std::__cxx11::string&)::prompt_prefix =
                 read_user_input(std::__cxx11::string&)::prompt_prefix_env;
            if (read_user_input(std::__cxx11::string&)::prompt_prefix_env == (char *)0x0) {
              read_user_input(std::__cxx11::string&)::prompt_prefix = "> ";
            }
            __cxa_guard_release(&read_user_input(std::__cxx11::string&)::prompt_prefix);
          }
        }
        pcVar10 = linenoise(read_user_input(std::__cxx11::string&)::prompt_prefix);
        if (pcVar10 == (char *)0x0) {
LAB_00129fbf:
          iVar6 = 0;
          goto LAB_0012a021;
        }
        std::__cxx11::string::assign((char *)&local_458);
        bVar3 = std::operator==(&local_458,"/bye");
        if (bVar3) {
          free(pcVar10);
          goto LAB_00129fbf;
        }
        if (local_458._M_string_length != 0) {
          linenoiseHistoryAdd(pcVar10);
          free(pcVar10);
          goto LAB_00129b73;
        }
        free(pcVar10);
      }
      std::__cxx11::string::_M_assign((string *)&local_458);
LAB_00129b73:
      cVar1 = chat_loop(LlamaData&,Opt_const&)::stdout_a_terminal;
      text = &opt.user;
      if (opt.user._M_string_length == 0) {
        text = &local_458;
      }
      add_message("user",text,&llama_data);
      iVar5 = apply_chat_template_with_error_handling
                        ((common_chat_templates *)
                         chat_templates._M_t.
                         super___uniq_ptr_impl<common_chat_templates,_common_chat_templates_deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_common_chat_templates_*,_common_chat_templates_deleter>
                         .super__Head_base<0UL,_common_chat_templates_*,_false>._M_head_impl,
                         &llama_data,true,&new_len,opt.use_jinja);
      if (iVar5 < 0) goto LAB_0012a021;
      prompt._M_dataplus._M_p = (pointer)&prompt.field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                ((string *)&prompt,
                 llama_data.fmtted.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + prev_len,
                 llama_data.fmtted.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + new_len);
      local_3d8._M_string_length = 0;
      local_3d8.field_2._M_local_buf[0] = '\0';
      local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
      if (cVar1 != '\0') {
        printf("\x1b[33m");
      }
      uVar11 = llama_model_get_vocab
                         (llama_data.model._M_t.
                          super___uniq_ptr_impl<llama_model,_llama_model_deleter>._M_t.
                          super__Tuple_impl<0UL,_llama_model_*,_llama_model_deleter>.
                          super__Head_base<0UL,_llama_model_*,_false>._M_head_impl);
      tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      iVar5 = llama_kv_self_used_cells
                        (llama_data.context._M_t.
                         super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                         super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                         super__Head_base<0UL,_llama_context_*,_false>._M_head_impl);
      iVar8 = llama_tokenize(uVar11,prompt._M_dataplus._M_p,(undefined4)prompt._M_string_length,0,0,
                             iVar5 == 0,1);
      std::vector<int,_std::allocator<int>_>::resize(&tokens,(long)-iVar8);
      iVar5 = llama_tokenize(uVar11,prompt._M_dataplus._M_p,(undefined4)prompt._M_string_length,
                             tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             (ulong)((long)tokens.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)tokens.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 2,iVar5 == 0,
                             1);
      if (iVar5 < 0) goto LAB_0012a074;
      if (0 < iVar8) goto LAB_00129fef;
      llama_batch_get_one(&file,tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                          (ulong)((long)tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                        .super__Vector_impl_data._M_finish -
                                 (long)tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start) >> 2);
      while( true ) {
        iVar5 = llama_n_ctx(llama_data.context._M_t.
                            super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                            super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                            super__Head_base<0UL,_llama_context_*,_false>._M_head_impl);
        iVar8 = llama_kv_self_used_cells
                          (llama_data.context._M_t.
                           super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                           super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                           super__Head_base<0UL,_llama_context_*,_false>._M_head_impl);
        if (iVar5 < iVar8 + (int)file.file) {
          puts("\x1b[0m");
          printe("context size exceeded\n");
        }
        uVar12 = (int)file.file;
        iVar5 = file.fd;
        uVar13 = local_408[0];
        uVar14 = auStack_400[0];
        uVar15 = local_3f8[0];
        uVar16 = auStack_3f0[0];
        uVar17 = local_3e8._0_8_;
        iVar8 = llama_decode(llama_data.context._M_t.
                             super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                             super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                             super__Head_base<0UL,_llama_context_*,_false>._M_head_impl);
        if (iVar8 != 0) {
          pcVar10 = "failed to decode\n";
          goto LAB_00129fcb;
        }
        new_token_id = llama_sampler_sample
                                 (llama_data.sampler._M_t.
                                  super___uniq_ptr_impl<llama_sampler,_llama_sampler_deleter>._M_t.
                                  super__Tuple_impl<0UL,_llama_sampler_*,_llama_sampler_deleter>.
                                  super__Head_base<0UL,_llama_sampler_*,_false>._M_head_impl,
                                  llama_data.context._M_t.
                                  super___uniq_ptr_impl<llama_context,_llama_context_deleter>._M_t.
                                  super__Tuple_impl<0UL,_llama_context_*,_llama_context_deleter>.
                                  super__Head_base<0UL,_llama_context_*,_false>._M_head_impl,
                                  0xffffffffffffffff);
        cVar4 = llama_vocab_is_eog(uVar11,new_token_id);
        if (cVar4 != '\0') break;
        piece._M_string_length = 0;
        piece.field_2._M_local_buf[0] = '\0';
        piece._M_dataplus._M_p = (pointer)&piece.field_2;
        uVar7 = llama_token_to_piece
                          (uVar11,new_token_id,buf,0x100,0,1,uVar12,iVar5,uVar13,uVar14,uVar15,
                           uVar16,uVar17);
        if ((int)uVar7 < 0) {
          printe("failed to convert token to piece\n");
          std::__cxx11::string::~string((string *)&piece);
          goto LAB_00129fef;
        }
        local_338[0] = local_328;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_338,buf,buf + uVar7);
        std::__cxx11::string::operator=((string *)&piece,(string *)local_338);
        std::__cxx11::string::~string((string *)local_338);
        printf("%s",piece._M_dataplus._M_p);
        fflush(_stdout);
        std::__cxx11::string::append((string *)&local_3d8);
        llama_batch_get_one(buf,&new_token_id,1);
        local_3e8[0] = buf[0x30];
        local_3e8[1] = buf[0x31];
        local_3e8[2] = buf[0x32];
        local_3e8[3] = buf[0x33];
        local_3e8[4] = buf[0x34];
        local_3e8[5] = buf[0x35];
        local_3e8[6] = buf[0x36];
        local_3e8[7] = buf[0x37];
        local_3f8 = (undefined4  [2])buf._32_8_;
        auStack_3f0 = (undefined4  [2])buf._40_8_;
        local_408 = (undefined4  [2])buf._16_8_;
        auStack_400 = (undefined4  [2])buf._24_8_;
        file.file = (FILE *)buf._0_8_;
        file._8_8_ = buf._8_8_;
        std::__cxx11::string::~string((string *)&piece);
      }
      printf("\x1b[0m");
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&tokens.super__Vector_base<int,_std::allocator<int>_>);
      pcVar10 = "";
      if (cVar1 != '\0') {
        pcVar10 = "\x1b[0m";
      }
      printf("\n%s",pcVar10);
      if (opt.user._M_string_length != 0) {
        std::__cxx11::string::~string((string *)&local_3d8);
        std::__cxx11::string::~string((string *)&prompt);
        std::__cxx11::string::~string((string *)&local_458);
        iVar6 = 0;
        goto LAB_0012a02e;
      }
      add_message("assistant",&local_3d8,&llama_data);
      iVar5 = apply_chat_template_with_error_handling
                        ((common_chat_templates *)
                         chat_templates._M_t.
                         super___uniq_ptr_impl<common_chat_templates,_common_chat_templates_deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_common_chat_templates_*,_common_chat_templates_deleter>
                         .super__Head_base<0UL,_common_chat_templates_*,_false>._M_head_impl,
                         &llama_data,false,&prev_len,opt.use_jinja);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&prompt);
      if (iVar5 < 0) goto LAB_0012a021;
      std::__cxx11::string::~string((string *)&local_458);
    } while( true );
  }
  iVar6 = 1;
  goto LAB_0012a045;
LAB_0012a074:
  pcVar10 = "failed to tokenize the prompt\n";
LAB_00129fcb:
  printe(pcVar10);
LAB_00129fef:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&tokens.super__Vector_base<int,_std::allocator<int>_>);
  printe("failed to generate response\n");
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&prompt);
LAB_0012a021:
  std::__cxx11::string::~string((string *)&local_458);
LAB_0012a02e:
  std::unique_ptr<common_chat_templates,_common_chat_templates_deleter>::~unique_ptr
            (&chat_templates);
  std::__cxx11::string::~string((string *)&chat_template);
LAB_0012a045:
  LlamaData::~LlamaData(&llama_data);
LAB_0012a052:
  Opt::~Opt(&opt);
  return iVar6;
}

Assistant:

int main(int argc, const char ** argv) {
    ctrl_c_handling();
    Opt       opt;
    const int ret = opt.init(argc, argv);
    if (ret == 2) {
        return 0;
    } else if (ret) {
        return 1;
    }

    if (!is_stdin_a_terminal()) {
        if (!opt.user.empty()) {
            opt.user += "\n\n";
        }

        opt.user += read_pipe_data();
    }

    llama_log_set(log_callback, &opt);
    LlamaData llama_data;
    if (llama_data.init(opt)) {
        return 1;
    }

    if (chat_loop(llama_data, opt)) {
        return 1;
    }

    return 0;
}